

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O1

int linux_eventfd_lower(eventfd *efd)

{
  uint uVar1;
  ssize_t sVar2;
  int *piVar3;
  uint64_t cur;
  undefined1 auStack_8 [8];
  
  sVar2 = read(efd->ef_id,auStack_8,8);
  if (sVar2 < 0) {
    piVar3 = __errno_location();
    uVar1 = 0;
    if (*piVar3 != 0xb) {
      uVar1 = -(uint)(*piVar3 != 4) | 0xfffffffc;
    }
  }
  else {
    uVar1 = -(uint)(sVar2 != 8);
  }
  return uVar1;
}

Assistant:

static int
linux_eventfd_lower(struct eventfd *efd)
{
    uint64_t cur;
    ssize_t n;
    int rv = 0;

    /*
     * Reset the counter
     * Because we're not using EFD_SEMPAHOR the level
     * state of the eventfd is cleared.
     *
     * Thus if there were multiple calls to
     * linux_eventfd_raise, and a single call to
     * linux_eventfd_lower, the eventfd state would
     * still be lowered.
     */
    dbg_printf("eventfd=%i - lowering event level", efd->ef_id);
    n = read(efd->ef_id, &cur, sizeof(cur));
    if (n < 0) {
        switch (errno) {
        case EAGAIN:
            /* Not considered an error */
            break;

        case EINTR:
            rv = -EINTR;
            break;

        default:
            dbg_printf("read(2): %s", strerror(errno));
            rv = -1;
        }
    } else if (n != sizeof(cur)) {
        dbg_puts("short read");
        rv = -1;
    }

    return (rv);
}